

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian.hpp
# Opt level: O0

short util::endianness<util::little_endian>::load_alien<short>(char *buffer)

{
  bool bVar1;
  char *in_RDI;
  short value;
  undefined2 local_2;
  
  bVar1 = big_endian::native();
  if (bVar1) {
    local_2 = util::detail::byteswap(0);
  }
  else {
    local_2 = little_endian::decode<short>(in_RDI);
  }
  return local_2;
}

Assistant:

static T load_alien(const char * buffer) {
		if(Endianness::reversed()) {
			T value;
			std::memcpy(&value, buffer, sizeof(value));
			return detail::byteswap(value);
		} else {
			return Endianness::template decode<T>(buffer);
		}
	}